

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_to_wal_test(bool multi_kv)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  __atomic_base<unsigned_long> metalen;
  char *pcVar8;
  long extraout_RDX;
  fdb_doc *ptr_handle;
  code *__ptr;
  timeval *__tv;
  fdb_config *fconfig_00;
  fdb_kvs_handle **ppfVar9;
  uint uVar10;
  uint uVar11;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  undefined7 in_register_00000039;
  fdb_doc **ppfVar16;
  fdb_kvs_handle **ppfVar17;
  fdb_kvs_handle *unaff_R12;
  long lVar18;
  fdb_kvs_handle *unaff_R13;
  btree *doc;
  ulong uVar19;
  fdb_kvs_config *config;
  char *pcVar20;
  filemgr_ops *pfVar21;
  fdb_config *fconfig_01;
  fdb_kvs_handle **__s;
  fdb_doc **doc_00;
  fdb_kvs_handle *doc_01;
  fdb_kvs_handle *pfVar22;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char keybuf [256];
  char metabuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_46f0;
  fdb_kvs_handle *pfStack_46e8;
  fdb_file_handle *pfStack_46e0;
  fdb_iterator *pfStack_46d8;
  fdb_doc *pfStack_46d0;
  fdb_kvs_handle *pfStack_46c8;
  timeval tStack_46c0;
  fdb_kvs_config fStack_46b0;
  fdb_config fStack_4698;
  fdb_config *pfStack_45a0;
  fdb_kvs_handle *pfStack_4598;
  fdb_kvs_handle *pfStack_4590;
  fdb_file_handle *pfStack_4588;
  fdb_kvs_handle *pfStack_4580;
  char acStack_4577 [15];
  filemgr *pfStack_4568;
  docio_handle *pdStack_4560;
  btreeblk_handle *pbStack_4558;
  size_t sStack_4550;
  filemgr *pfStack_4548;
  docio_handle *pdStack_4540;
  btreeblk_handle *pbStack_4538;
  timeval tStack_4530;
  undefined1 auStack_4520 [76];
  uint uStack_44d4;
  char *pcStack_43e0;
  atomic<unsigned_long> aStack_43d8;
  btree *pbStack_43d0;
  fdb_kvs_handle *pfStack_43c8;
  fdb_kvs_handle *pfStack_43c0;
  code *pcStack_43b8;
  uint uStack_43a4;
  fdb_txn *pfStack_43a0;
  fdb_kvs_handle *pfStack_4398;
  fdb_iterator *pfStack_4390;
  fdb_snapshot_info_t *pfStack_4388;
  int iStack_437c;
  fdb_kvs_handle *pfStack_4378;
  fdb_kvs_handle *apfStack_4370 [3];
  uint64_t uStack_4358;
  fdb_kvs_config fStack_4350;
  char acStack_4338 [8];
  timeval tStack_4330;
  char acStack_4320 [256];
  btree bStack_4220;
  char acStack_41d0 [256];
  char acStack_40d0 [256];
  fdb_config fStack_3fd0;
  fdb_kvs_handle **ppfStack_3ed8;
  fdb_kvs_handle **ppfStack_3ed0;
  fdb_kvs_handle *pfStack_3ec8;
  fdb_kvs_handle **ppfStack_3ec0;
  fdb_kvs_handle *pfStack_3eb8;
  code *pcStack_3eb0;
  fdb_kvs_handle **ppfStack_3ea8;
  fdb_kvs_handle *pfStack_3ea0;
  fdb_kvs_handle *apfStack_3e98 [9];
  fdb_kvs_config fStack_3e50;
  timeval tStack_3e38;
  fdb_kvs_handle *apfStack_3e28 [33];
  fdb_config fStack_3d20;
  fdb_kvs_handle *apfStack_3c28 [32];
  fdb_kvs_handle *apfStack_3b28 [32];
  fdb_kvs_handle afStack_3a28 [15];
  fdb_config *pfStack_1a20;
  fdb_kvs_handle *pfStack_1a18;
  fdb_kvs_handle *pfStack_1a10;
  fdb_config *pfStack_1a08;
  fdb_kvs_handle *pfStack_1a00;
  fdb_kvs_handle *pfStack_19f8;
  fdb_kvs_handle *pfStack_19e8;
  fdb_file_handle *pfStack_19e0;
  fdb_iterator *pfStack_19d8;
  fdb_doc *pfStack_19d0;
  fdb_kvs_handle *pfStack_19c8;
  undefined1 auStack_19bf [31];
  undefined1 auStack_19a0 [72];
  fdb_config fStack_1958;
  timeval *ptStack_1860;
  fdb_kvs_handle *pfStack_1858;
  fdb_kvs_handle *pfStack_1850;
  fdb_config *pfStack_1848;
  fdb_kvs_handle *pfStack_1840;
  fdb_kvs_handle *pfStack_1830;
  fdb_file_handle *pfStack_1828;
  undefined4 uStack_181c;
  pthread_t pStack_1818;
  undefined1 auStack_180f [63];
  undefined1 auStack_17d0 [16];
  uint64_t uStack_17c0;
  fdb_config fStack_16d8;
  fdb_kvs_handle *pfStack_15d8;
  fdb_kvs_handle *pfStack_15d0;
  filemgr_ops *pfStack_15c8;
  fdb_kvs_handle *pfStack_15c0;
  fdb_kvs_handle *pfStack_15b8;
  timeval tStack_15a8;
  fdb_kvs_handle *pfStack_1598;
  fdb_kvs_handle *pfStack_1590;
  fdb_kvs_handle *pfStack_1580;
  fdb_kvs_handle *pfStack_1578;
  fdb_kvs_handle *pfStack_1570;
  fdb_file_handle *pfStack_1568;
  undefined1 auStack_155c [12];
  kvs_ops_stat *pkStack_1550;
  atomic<unsigned_long> aStack_1548;
  timeval tStack_1518;
  __atomic_base<unsigned_long> _Stack_1508;
  kvs_ops_stat *pkStack_1500;
  __atomic_base<unsigned_long> _Stack_14f8;
  fdb_kvs_info fStack_14e8;
  undefined1 uStack_1498;
  undefined1 uStack_148a;
  btree *pbStack_1480;
  code *pcStack_1460;
  uint8_t auStack_1458 [8];
  filemgr_ops *pfStack_1450;
  fdb_kvs_handle *pfStack_13c0;
  fdb_kvs_handle *pfStack_13b8;
  fdb_kvs_handle *pfStack_13b0;
  fdb_txn *pfStack_13a8;
  fdb_kvs_handle *pfStack_13a0;
  fdb_kvs_handle *pfStack_1398;
  fdb_file_handle *pfStack_1388;
  int iStack_137c;
  fdb_kvs_handle *pfStack_1378;
  fdb_kvs_handle *pfStack_1370;
  undefined1 auStack_1368 [48];
  __atomic_base<unsigned_long> _Stack_1338;
  undefined1 auStack_1330 [32];
  fdb_kvs_info fStack_1310;
  timeval tStack_12e0;
  undefined1 auStack_12d0 [160];
  char acStack_1230 [256];
  char acStack_1130 [256];
  fdb_kvs_handle fStack_1030;
  fdb_kvs_handle *pfStack_e28;
  fdb_kvs_config *pfStack_e20;
  fdb_doc **ppfStack_e18;
  code *pcStack_e10;
  undefined1 local_df8 [72];
  fdb_kvs_config local_db0;
  fdb_doc local_d98 [3];
  char local_c98 [256];
  char local_b98 [264];
  fdb_config local_a90;
  fdb_doc *pfStack_998;
  size_t *local_990;
  fdb_doc *local_4e8 [151];
  
  pcVar8 = (char *)(CONCAT71(in_register_00000039,multi_kv) & 0xffffffff);
  pcStack_e10 = (code *)0x11ab0d;
  gettimeofday((timeval *)(local_df8 + 0x38),(__timezone_ptr_t)0x0);
  pcStack_e10 = (code *)0x11ab12;
  memleak_start();
  pcStack_e10 = (code *)0x11ab1e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_e10 = (code *)0x11ab2e;
  fdb_get_default_config();
  config = &local_db0;
  pcStack_e10 = (code *)0x11ab3b;
  fdb_get_default_kvs_config();
  local_a90.buffercache_size = 0;
  local_a90.wal_threshold = 0x100;
  local_a90.flags = 1;
  local_a90.compaction_threshold = '\0';
  local_df8._28_4_ = (undefined4)CONCAT71(in_register_00000039,multi_kv);
  local_a90.multi_kv_instances = SUB81(pcVar8,0);
  doc_00 = (fdb_doc **)(local_df8 + 8);
  pcStack_e10 = (code *)0x11ab75;
  fdb_open((fdb_file_handle **)doc_00,"./mvcc_test8",&local_a90);
  ptr_handle = (fdb_doc *)local_df8;
  pcStack_e10 = (code *)0x11ab88;
  fdb_kvs_open_default((fdb_file_handle *)local_df8._8_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_e10 = (code *)0x11ab9e;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_df8._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar18 = 0;
    uVar19 = 0;
    do {
      pcStack_e10 = (code *)0x11abc8;
      sprintf(local_c98,"key%d",uVar19 & 0xffffffff);
      pcStack_e10 = (code *)0x11abe1;
      sprintf(local_b98,"meta%d",uVar19 & 0xffffffff);
      pcStack_e10 = (code *)0x11abf7;
      sprintf((char *)local_d98,"body%d",uVar19 & 0xffffffff);
      pcStack_e10 = (code *)0x11ac0a;
      sVar5 = strlen(local_c98);
      pcStack_e10 = (code *)0x11ac1d;
      sVar6 = strlen(local_b98);
      pcStack_e10 = (code *)0x11ac2a;
      sVar7 = strlen((char *)local_d98);
      pcStack_e10 = (code *)0x11ac4c;
      fdb_doc_create((fdb_doc **)((long)&pfStack_998 + lVar18),local_c98,sVar5,local_b98,sVar6,
                     local_d98,sVar7);
      pcStack_e10 = (code *)0x11ac5e;
      fdb_set((fdb_kvs_handle *)local_df8._0_8_,(&pfStack_998)[uVar19]);
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar19 != 300);
    pcStack_e10 = (code *)0x11ac7e;
    fdb_commit((fdb_file_handle *)local_df8._8_8_,'\0');
    lVar18 = 0;
    uVar19 = 0;
    do {
      local_df8._40_8_ = (fdb_doc **)((long)&pfStack_998 + lVar18);
      pcStack_e10 = (code *)0x11aca0;
      fdb_doc_free((&pfStack_998)[uVar19]);
      pcStack_e10 = (code *)0x11acbc;
      sprintf(local_c98,"key%d",uVar19 & 0xffffffff);
      pcStack_e10 = (code *)0x11acd8;
      sprintf(local_b98,"META%d",uVar19 & 0xffffffff);
      pcStack_e10 = (code *)0x11acf1;
      sprintf((char *)local_d98,"BODY%d",uVar19 & 0xffffffff);
      pcStack_e10 = (code *)0x11acf9;
      sVar5 = strlen(local_c98);
      pcStack_e10 = (code *)0x11ad04;
      sVar6 = strlen(local_b98);
      pcStack_e10 = (code *)0x11ad0f;
      sVar7 = strlen((char *)local_d98);
      pcStack_e10 = (code *)0x11ad31;
      fdb_doc_create((fdb_doc **)local_df8._40_8_,local_c98,sVar5,local_b98,sVar6,local_d98,sVar7);
      pcStack_e10 = (code *)0x11ad43;
      fdb_set((fdb_kvs_handle *)local_df8._0_8_,(&pfStack_998)[uVar19]);
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar19 != 0x96);
    pcStack_e10 = (code *)0x11ad63;
    fdb_commit((fdb_file_handle *)local_df8._8_8_,'\0');
    uVar19 = 0x96;
    doc_00 = local_4e8;
    do {
      pcStack_e10 = (code *)0x11ad79;
      fdb_doc_free(*doc_00);
      pcStack_e10 = (code *)0x11ad95;
      sprintf(local_c98,"key%d",uVar19 & 0xffffffff);
      pcVar8 = local_b98;
      pcStack_e10 = (code *)0x11adb1;
      sprintf(pcVar8,"Meta%d",uVar19 & 0xffffffff);
      ptr_handle = local_d98;
      pcStack_e10 = (code *)0x11adca;
      sprintf((char *)ptr_handle,"Body%d",uVar19 & 0xffffffff);
      pcStack_e10 = (code *)0x11add2;
      unaff_R12 = (fdb_kvs_handle *)strlen(local_c98);
      pcStack_e10 = (code *)0x11addd;
      unaff_R13 = (fdb_kvs_handle *)strlen(pcVar8);
      pcStack_e10 = (code *)0x11ade8;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_e10 = (code *)0x11ae08;
      fdb_doc_create(doc_00,local_c98,(size_t)unaff_R12,pcVar8,(size_t)unaff_R13,ptr_handle,sVar5);
      pcStack_e10 = (code *)0x11ae15;
      fdb_set((fdb_kvs_handle *)local_df8._0_8_,*doc_00);
      uVar19 = uVar19 + 1;
      doc_00 = doc_00 + 1;
    } while (uVar19 != 300);
    pcStack_e10 = (code *)0x11ae35;
    fdb_commit((fdb_file_handle *)local_df8._8_8_,'\0');
    pcStack_e10 = (code *)0x11ae44;
    fVar2 = fdb_rollback((fdb_kvs_handle **)local_df8,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afa5;
    pcStack_e10 = (code *)0x11ae75;
    fdb_doc_create((fdb_doc **)(local_df8 + 0x10),(void *)local_990[4],*local_990,(void *)0x0,0,
                   (void *)0x0,0);
    pcStack_e10 = (code *)0x11ae89;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)local_df8._0_8_,
                              (fdb_kvs_handle **)(local_df8 + 0x20),0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaa;
    pcStack_e10 = (code *)0x11aea0;
    fVar2 = fdb_get((fdb_kvs_handle *)local_df8._32_8_,(fdb_doc *)local_df8._16_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaf;
    config = *(fdb_kvs_config **)(local_df8._16_8_ + 0x40);
    doc_00 = (fdb_doc **)local_990[8];
    pcStack_e10 = (code *)0x11aecc;
    iVar3 = bcmp(config,doc_00,*(size_t *)(local_df8._16_8_ + 0x10));
    ptr_handle = (fdb_doc *)local_df8._16_8_;
    if (iVar3 == 0) {
      if (*(fdb_seqnum_t *)(local_df8._16_8_ + 0x28) != 0x12e) {
        pcStack_e10 = (code *)0x11aef0;
        rollback_to_wal_test();
        local_df8._16_8_ = local_df8._48_8_;
      }
      pcStack_e10 = (code *)0x11aefb;
      fdb_doc_free((fdb_doc *)local_df8._16_8_);
      pcStack_e10 = (code *)0x11af05;
      fdb_kvs_close((fdb_kvs_handle *)local_df8._32_8_);
      pcStack_e10 = (code *)0x11af0f;
      fdb_close((fdb_file_handle *)local_df8._8_8_);
      lVar18 = 0;
      do {
        pcStack_e10 = (code *)0x11af1e;
        fdb_doc_free((&pfStack_998)[lVar18]);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 300);
      pcStack_e10 = (code *)0x11af2f;
      fdb_shutdown();
      pcStack_e10 = (code *)0x11af34;
      memleak_end();
      pcVar8 = "single kv mode:";
      if (local_df8[0x1c] != '\0') {
        pcVar8 = "multiple kv mode:";
      }
      pcStack_e10 = (code *)0x11af61;
      sprintf((char *)local_d98,"rollback to wal test %s",pcVar8);
      pcVar8 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_e10 = (code *)0x11af8e;
      fprintf(_stderr,pcVar8,local_d98);
      return;
    }
  }
  else {
    pcStack_e10 = (code *)0x11afa5;
    rollback_to_wal_test();
LAB_0011afa5:
    pcStack_e10 = (code *)0x11afaa;
    rollback_to_wal_test();
LAB_0011afaa:
    pcStack_e10 = (code *)0x11afaf;
    rollback_to_wal_test();
LAB_0011afaf:
    pcStack_e10 = (code *)0x11afb4;
    rollback_to_wal_test();
  }
  pcStack_e10 = rollback_all_test;
  ppfVar16 = doc_00;
  rollback_to_wal_test();
  pfStack_1398 = (fdb_kvs_handle *)0x11afe4;
  fStack_1030.bub_ctx.space_used = (uint64_t)ptr_handle;
  fStack_1030.bub_ctx.handle = unaff_R12;
  pfStack_e28 = unaff_R13;
  pfStack_e20 = config;
  ppfStack_e18 = doc_00;
  pcStack_e10 = (code *)pcVar8;
  gettimeofday(&tStack_12e0,(__timezone_ptr_t)0x0);
  pfStack_1398 = (fdb_kvs_handle *)0x11afe9;
  memleak_start();
  pfStack_1398 = (fdb_kvs_handle *)0x11aff5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1398 = (fdb_kvs_handle *)0x11b005;
  fdb_get_default_config();
  pfStack_1398 = (fdb_kvs_handle *)0x11b00f;
  fdb_get_default_kvs_config();
  fStack_1030.config.encryption_key.bytes[4] = '\0';
  fStack_1030.config.encryption_key.bytes[5] = '\0';
  fStack_1030.config.encryption_key.bytes[6] = '\0';
  fStack_1030.config.encryption_key.bytes[7] = '\0';
  fStack_1030.config.encryption_key.bytes[8] = '\0';
  fStack_1030.config.encryption_key.bytes[9] = '\0';
  fStack_1030.config.encryption_key.bytes[10] = '\0';
  fStack_1030.config.encryption_key.bytes[0xb] = '\0';
  fStack_1030.config.encryption_key.bytes[0xc] = '\0';
  fStack_1030.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1030.config.encryption_key.bytes[0xe] = '\0';
  fStack_1030.config.encryption_key.bytes[0xf] = '\0';
  fStack_1030.config.encryption_key.bytes[0x10] = '\0';
  fStack_1030.config.encryption_key.bytes[0x11] = '\0';
  fStack_1030.config.encryption_key.bytes[0x12] = '\0';
  fStack_1030.config.encryption_key.bytes[0x13] = '\0';
  fStack_1030.config._180_4_ = 1;
  fStack_1030.config.block_reusing_threshold._7_1_ = 0;
  fStack_1030.max_seqnum = 0;
  pfStack_1398 = (fdb_kvs_handle *)0x11b045;
  fStack_1030.config.num_keeping_headers._0_1_ = (char)ppfVar16;
  fdb_open(&pfStack_1388,"./mvcc_test6",(fdb_config *)&fStack_1030.config.encryption_key);
  iStack_137c = (int)ppfVar16;
  if (iStack_137c == 0) {
    pfStack_1398 = (fdb_kvs_handle *)0x11b0b1;
    fdb_kvs_open_default
              (pfStack_1388,(fdb_kvs_handle **)(auStack_1368 + 8),
               (fdb_kvs_config *)(auStack_1330 + 8));
    pfVar12 = (fdb_kvs_handle *)0x1;
  }
  else {
    ppfVar9 = (fdb_kvs_handle **)(auStack_1368 + 8);
    unaff_R12 = (fdb_kvs_handle *)(auStack_1330 + 8);
    uVar19 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b076;
      sprintf(auStack_1330,"kv%d",uVar19 & 0xffffffff);
      pfStack_1398 = (fdb_kvs_handle *)0x11b089;
      fdb_kvs_open(pfStack_1388,ppfVar9,auStack_1330,(fdb_kvs_config *)unaff_R12);
      uVar19 = uVar19 + 1;
      ppfVar9 = ppfVar9 + 1;
    } while (uVar19 != 4);
    pfVar12 = (fdb_kvs_handle *)0x4;
    unaff_R13 = (fdb_kvs_handle *)0x4;
  }
  pcVar20 = (char *)0x0;
  __ptr = logCallbackFunc;
  pcVar8 = "rollback_all_test";
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b0d7;
    fVar2 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_1368 + (long)pcVar20 * 8 + 8),logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1398 = (fdb_kvs_handle *)0x11b7d0;
      rollback_all_test();
      goto LAB_0011b7d0;
    }
    pcVar20 = (char *)((long)&((fdb_txn *)pcVar20)->handle + 1);
  } while (pfVar12 != (fdb_kvs_handle *)pcVar20);
  uVar19 = 0;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b106;
    sprintf(acStack_1130,"key%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b122;
    sprintf(acStack_1230,"meta%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b13e;
    sprintf((char *)&fStack_1030,"body%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b151;
    sVar5 = strlen(acStack_1130);
    pfStack_1398 = (fdb_kvs_handle *)0x11b15c;
    sVar6 = strlen(acStack_1230);
    pfStack_1398 = (fdb_kvs_handle *)0x11b167;
    sVar7 = strlen((char *)&fStack_1030);
    pfStack_1398 = (fdb_kvs_handle *)0x11b18c;
    fdb_doc_create((fdb_doc **)(auStack_12d0 + uVar19 * 8),acStack_1130,sVar5,acStack_1230,sVar6,
                   &fStack_1030,sVar7);
    lVar18 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b19c;
      fdb_set(*(fdb_kvs_handle **)(auStack_1368 + lVar18 * 8 + 8),
              *(fdb_doc **)(auStack_12d0 + uVar19 * 8));
      lVar18 = lVar18 + 1;
    } while (pfVar12 != (fdb_kvs_handle *)lVar18);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 5);
  pfStack_1398 = (fdb_kvs_handle *)0x11b1c0;
  fdb_commit(pfStack_1388,'\x01');
  uVar19 = 5;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b1e2;
    sprintf(acStack_1130,"key%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b1fe;
    sprintf(acStack_1230,"meta%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b21a;
    sprintf((char *)&fStack_1030,"body%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b22d;
    sVar5 = strlen(acStack_1130);
    pfStack_1398 = (fdb_kvs_handle *)0x11b238;
    sVar6 = strlen(acStack_1230);
    pfStack_1398 = (fdb_kvs_handle *)0x11b243;
    sVar7 = strlen((char *)&fStack_1030);
    pfStack_1398 = (fdb_kvs_handle *)0x11b268;
    fdb_doc_create((fdb_doc **)(auStack_12d0 + uVar19 * 8),acStack_1130,sVar5,acStack_1230,sVar6,
                   &fStack_1030,sVar7);
    lVar18 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b279;
      fdb_set(*(fdb_kvs_handle **)(auStack_1368 + lVar18 * 8 + 8),
              *(fdb_doc **)(auStack_12d0 + uVar19 * 8));
      lVar18 = lVar18 + 1;
    } while (pfVar12 != (fdb_kvs_handle *)lVar18);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 10);
  pfStack_1398 = (fdb_kvs_handle *)0x11b29a;
  fdb_commit(pfStack_1388,'\0');
  uVar19 = 10;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b2bc;
    sprintf(acStack_1130,"key%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b2d8;
    sprintf(acStack_1230,"meta%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b2f4;
    sprintf((char *)&fStack_1030,"body%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b307;
    sVar5 = strlen(acStack_1130);
    pfStack_1398 = (fdb_kvs_handle *)0x11b312;
    sVar6 = strlen(acStack_1230);
    pfStack_1398 = (fdb_kvs_handle *)0x11b31d;
    sVar7 = strlen((char *)&fStack_1030);
    pfStack_1398 = (fdb_kvs_handle *)0x11b342;
    fdb_doc_create((fdb_doc **)(auStack_12d0 + uVar19 * 8),acStack_1130,sVar5,acStack_1230,sVar6,
                   &fStack_1030,sVar7);
    lVar18 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b353;
      fdb_set(*(fdb_kvs_handle **)(auStack_1368 + lVar18 * 8 + 8),
              *(fdb_doc **)(auStack_12d0 + uVar19 * 8));
      lVar18 = lVar18 + 1;
    } while (pfVar12 != (fdb_kvs_handle *)lVar18);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0xf);
  pfStack_1398 = (fdb_kvs_handle *)0x11b377;
  fdb_commit(pfStack_1388,'\x01');
  uVar19 = 0xf;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b399;
    sprintf(acStack_1130,"key%d",uVar19 & 0xffffffff);
    pfStack_1398 = (fdb_kvs_handle *)0x11b3b5;
    sprintf(acStack_1230,"meta%d",uVar19 & 0xffffffff);
    pfVar22 = &fStack_1030;
    pfStack_1398 = (fdb_kvs_handle *)0x11b3d1;
    sprintf((char *)pfVar22,"body%d",uVar19 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(auStack_12d0 + uVar19 * 8);
    pfStack_1398 = (fdb_kvs_handle *)0x11b3e4;
    sVar5 = strlen(acStack_1130);
    pfStack_1398 = (fdb_kvs_handle *)0x11b3ef;
    unaff_R13 = (fdb_kvs_handle *)strlen(acStack_1230);
    pfStack_1398 = (fdb_kvs_handle *)0x11b3fa;
    sVar6 = strlen((char *)pfVar22);
    pfStack_1398 = (fdb_kvs_handle *)0x11b41f;
    fdb_doc_create((fdb_doc **)unaff_R12,acStack_1130,sVar5,acStack_1230,(size_t)unaff_R13,pfVar22,
                   sVar6);
    pcVar20 = (char *)0x0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b430;
      fdb_set(*(fdb_kvs_handle **)(auStack_1368 + (long)pcVar20 * 8 + 8),
              *(fdb_doc **)&unaff_R12->kvs_config);
      pcVar20 = (char *)((long)pcVar20 + 1);
    } while (pfVar12 != (fdb_kvs_handle *)pcVar20);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x14);
  pfStack_1398 = (fdb_kvs_handle *)0x11b451;
  fdb_commit(pfStack_1388,'\0');
  pfStack_1398 = (fdb_kvs_handle *)0x11b465;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_1388,(fdb_snapshot_info_t **)&pfStack_1370,(uint64_t *)&pfStack_1378);
  pcVar8 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f6;
  if ((char)iStack_137c == '\0') {
    if (pfStack_1378 != (fdb_kvs_handle *)0x4) {
      pfStack_1398 = (fdb_kvs_handle *)0x11b49b;
      rollback_all_test();
    }
  }
  else if (pfStack_1378 != (fdb_kvs_handle *)0x8) {
    pfStack_1398 = (fdb_kvs_handle *)0x11b489;
    rollback_all_test();
  }
  pfStack_1398 = (fdb_kvs_handle *)0x11b4ae;
  fVar2 = fdb_rollback_all(pfStack_1388,(fdb_snapshot_marker_t)pfStack_1370->kvs);
  if ((char)iStack_137c == '\0') {
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7fb;
LAB_0011b5f4:
    unaff_R12 = (fdb_kvs_handle *)0x0;
    unaff_R13 = (fdb_kvs_handle *)auStack_1368;
    pcVar8 = (char *)&_Stack_1338;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b613;
      fVar2 = fdb_get_kvs_info(*(fdb_kvs_handle **)(auStack_1368 + (long)unaff_R12 * 8 + 8),
                               &fStack_1310);
      __ptr = (code *)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7d5;
      if ((hbtrie *)fStack_1310.last_seqnum != (hbtrie *)0xf) {
        pfStack_1398 = (fdb_kvs_handle *)0x11b6c7;
        rollback_all_test();
      }
      if ((filemgr_ops *)fStack_1310.doc_count != (filemgr_ops *)0xf) {
        pfStack_1398 = (fdb_kvs_handle *)0x11b6d9;
        rollback_all_test();
      }
      pfStack_1398 = (fdb_kvs_handle *)0x11b64b;
      fVar2 = fdb_get(*(fdb_kvs_handle **)(auStack_1368 + (long)unaff_R12 * 8 + 8),
                      (fdb_doc *)auStack_12d0._152_8_);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b7d0;
      pfStack_1398 = (fdb_kvs_handle *)0x11b673;
      fVar2 = fdb_get_kv(*(fdb_kvs_handle **)(auStack_1368 + (long)unaff_R12 * 8 + 8),
                         *(_func_cs_off_t_int **)(auStack_12d0._0_8_ + 0x20),
                         (size_t)*(_func_int_char_ptr_int_mode_t **)auStack_12d0._0_8_,
                         (void **)unaff_R13,(size_t *)pcVar8);
      __ptr = (code *)auStack_1368._0_8_;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e2;
      pcVar20 = *(char **)(auStack_12d0._0_8_ + 0x40);
      pfStack_1398 = (fdb_kvs_handle *)0x11b69c;
      iVar3 = bcmp(pcVar20,(void *)auStack_1368._0_8_,_Stack_1338._M_i);
      if (iVar3 != 0) goto LAB_0011b7da;
      pfStack_1398 = (fdb_kvs_handle *)0x11b6ac;
      free(__ptr);
      unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
      pfVar22 = (fdb_kvs_handle *)__ptr;
    } while (pfVar12 != unaff_R12);
    pfVar22 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b6f2;
      fVar2 = fdb_set(*(fdb_kvs_handle **)(auStack_1368 + (long)pfVar22 * 8 + 8),
                      (fdb_doc *)auStack_12d0._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e7;
      pfVar22 = (fdb_kvs_handle *)&(pfVar22->kvs_config).field_0x1;
    } while (pfVar12 != pfVar22);
    pfStack_1398 = (fdb_kvs_handle *)0x11b711;
    fVar2 = fdb_commit(pfStack_1388,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b800;
    pfStack_1398 = (fdb_kvs_handle *)0x11b723;
    fdb_close(pfStack_1388);
    lVar18 = 0;
    do {
      pfStack_1398 = (fdb_kvs_handle *)0x11b732;
      fdb_doc_free(*(fdb_doc **)(auStack_12d0 + lVar18 * 8));
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x14);
    pfStack_1398 = (fdb_kvs_handle *)0x11b74a;
    fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_1370,(uint64_t)pfStack_1378);
    pfVar22 = (fdb_kvs_handle *)0x14;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1398 = (fdb_kvs_handle *)0x11b757;
      fdb_shutdown();
      pfStack_1398 = (fdb_kvs_handle *)0x11b75c;
      memleak_end();
      pcVar8 = "single kv mode:";
      if ((char)iStack_137c != '\0') {
        pcVar8 = "multiple kv mode:";
      }
      pfStack_1398 = (fdb_kvs_handle *)0x11b78c;
      sprintf((char *)&fStack_1030,"rollback all test %s",pcVar8);
      pcVar8 = "%s PASSED\n";
      if (rollback_all_test(bool)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_1398 = (fdb_kvs_handle *)0x11b7b9;
      fprintf(_stderr,pcVar8,&fStack_1030);
      return;
    }
    goto LAB_0011b805;
  }
  if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b80a;
  pfVar22 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1398 = (fdb_kvs_handle *)0x11b4ce;
    fdb_kvs_close(*(fdb_kvs_handle **)(auStack_1368 + (long)pfVar22 * 8 + 8));
    pfVar22 = (fdb_kvs_handle *)((long)pfVar22 + 1);
  } while (pfVar12 != pfVar22);
  pfStack_1398 = (fdb_kvs_handle *)0x11b4f2;
  fVar2 = fdb_open((fdb_file_handle **)&fStack_1310,"./mvcc_test6",
                   (fdb_config *)&fStack_1030.config.encryption_key);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b80f;
  pfStack_1398 = (fdb_kvs_handle *)0x11b518;
  fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_1310.name,(fdb_kvs_handle **)auStack_1368,"kv0",
                       (fdb_kvs_config *)(auStack_1330 + 8));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b814;
  pfStack_1398 = (fdb_kvs_handle *)0x11b533;
  fVar2 = fdb_rollback_all(pfStack_1388,(fdb_snapshot_marker_t)pfStack_1370->kvs);
  if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b819;
  pfStack_1398 = (fdb_kvs_handle *)0x11b546;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)auStack_1368._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b81e;
  pfStack_1398 = (fdb_kvs_handle *)0x11b55b;
  fVar2 = fdb_close((fdb_file_handle *)fStack_1310.name);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_1398 = (fdb_kvs_handle *)0x11b576;
    fVar2 = fdb_rollback_all(pfStack_1388,(fdb_snapshot_marker_t)pfStack_1370->kvs);
    unaff_R13 = (fdb_kvs_handle *)(auStack_1368 + 8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcVar8 = auStack_1330;
      pcVar20 = "rollback_all_test";
      pfVar22 = (fdb_kvs_handle *)0x0;
      unaff_R12 = pfVar12;
      do {
        pfStack_1398 = (fdb_kvs_handle *)0x11b5a7;
        sprintf(pcVar8,"kv%d",pfVar22);
        pfStack_1398 = (fdb_kvs_handle *)0x11b5bc;
        fVar2 = fdb_kvs_open(pfStack_1388,(fdb_kvs_handle **)unaff_R13,pcVar8,
                             (fdb_kvs_config *)(auStack_1330 + 8));
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f1;
        pfStack_1398 = (fdb_kvs_handle *)0x11b5d7;
        fVar2 = fdb_set_log_callback
                          (*(fdb_kvs_handle **)&unaff_R13->kvs_config,logCallbackFunc,
                           "rollback_all_test");
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7ec;
        pfVar22 = (fdb_kvs_handle *)(ulong)((int)pfVar22 + 1);
        unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).custom_cmp;
        unaff_R12 = (fdb_kvs_handle *)((long)&unaff_R12[-1].bub_ctx.handle + 7);
      } while (unaff_R12 != (fdb_kvs_handle *)0x0);
      goto LAB_0011b5f4;
    }
    goto LAB_0011b7fb;
  }
  goto LAB_0011b823;
LAB_0011bfab:
  pfStack_1840 = (fdb_kvs_handle *)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  pfStack_1840 = (fdb_kvs_handle *)0x11bfb5;
  rollback_during_ops_test();
  goto LAB_0011bfb5;
LAB_0011c3a8:
  pfStack_19f8 = (fdb_kvs_handle *)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_3eb0 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_3eb0 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_3eb0 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_3eb0 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_3eb0 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_3eb0 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_3eb0 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_43b8 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_4590 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_4590 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011b7d0:
  pfStack_1398 = (fdb_kvs_handle *)0x11b7d5;
  rollback_all_test();
LAB_0011b7d5:
  pfStack_1398 = (fdb_kvs_handle *)0x11b7da;
  rollback_all_test();
LAB_0011b7da:
  pfStack_1398 = (fdb_kvs_handle *)0x11b7e2;
  rollback_all_test();
  pfVar22 = (fdb_kvs_handle *)__ptr;
LAB_0011b7e2:
  pfStack_1398 = (fdb_kvs_handle *)0x11b7e7;
  rollback_all_test();
LAB_0011b7e7:
  pfStack_1398 = (fdb_kvs_handle *)0x11b7ec;
  rollback_all_test();
LAB_0011b7ec:
  pfStack_1398 = (fdb_kvs_handle *)0x11b7f1;
  rollback_all_test();
LAB_0011b7f1:
  pfStack_1398 = (fdb_kvs_handle *)0x11b7f6;
  rollback_all_test();
LAB_0011b7f6:
  pfStack_1398 = (fdb_kvs_handle *)0x11b7fb;
  rollback_all_test();
LAB_0011b7fb:
  pfStack_1398 = (fdb_kvs_handle *)0x11b800;
  rollback_all_test();
LAB_0011b800:
  pfStack_1398 = (fdb_kvs_handle *)0x11b805;
  rollback_all_test();
LAB_0011b805:
  pfStack_1398 = (fdb_kvs_handle *)0x11b80a;
  rollback_all_test();
LAB_0011b80a:
  pfStack_1398 = (fdb_kvs_handle *)0x11b80f;
  rollback_all_test();
LAB_0011b80f:
  pfStack_1398 = (fdb_kvs_handle *)0x11b814;
  rollback_all_test();
LAB_0011b814:
  pfStack_1398 = (fdb_kvs_handle *)0x11b819;
  rollback_all_test();
LAB_0011b819:
  pfStack_1398 = (fdb_kvs_handle *)0x11b81e;
  rollback_all_test();
LAB_0011b81e:
  pfStack_1398 = (fdb_kvs_handle *)0x11b823;
  rollback_all_test();
LAB_0011b823:
  pfStack_1398 = (fdb_kvs_handle *)auto_compaction_snapshots_test;
  rollback_all_test();
  pfStack_1590 = (fdb_kvs_handle *)0x11b845;
  pfStack_13c0 = pfVar22;
  pfStack_13b8 = unaff_R12;
  pfStack_13b0 = unaff_R13;
  pfStack_13a8 = (fdb_txn *)pcVar20;
  pfStack_13a0 = (fdb_kvs_handle *)pcVar8;
  pfStack_1398 = pfVar12;
  gettimeofday(&tStack_1518,(__timezone_ptr_t)0x0);
  pfStack_1590 = (fdb_kvs_handle *)0x11b84a;
  memleak_start();
  pfVar21 = (filemgr_ops *)auStack_155c;
  auStack_155c._0_4_ = 0;
  pfStack_1590 = (fdb_kvs_handle *)0x11b862;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar22 = (fdb_kvs_handle *)&stack0xffffffffffffeb48;
  pfStack_1590 = (fdb_kvs_handle *)0x11b872;
  fdb_get_default_config();
  uStack_148a = 1;
  uStack_1498 = 1;
  pcStack_1460 = compaction_cb_count;
  auStack_1458[0] = ' ';
  auStack_1458[1] = '\0';
  auStack_1458[2] = '\0';
  auStack_1458[3] = '\0';
  pbStack_1480 = (btree *)0x1;
  pfVar15 = (fdb_kvs_handle *)0x155054;
  pfStack_1590 = (fdb_kvs_handle *)0x11b8ac;
  pfStack_1450 = pfVar21;
  fVar2 = fdb_open(&pfStack_1568,"mvcc_test1",(fdb_config *)pfVar22);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar22 = (fdb_kvs_handle *)(auStack_155c + 4);
    pfStack_1590 = (fdb_kvs_handle *)0x11b8c1;
    fdb_get_default_kvs_config();
    _Stack_14f8 = aStack_1548.super___atomic_base<unsigned_long>._M_i;
    _Stack_1508._M_i = auStack_155c._4_8_;
    pkStack_1500 = pkStack_1550;
    pfVar15 = (fdb_kvs_handle *)&pfStack_1570;
    pfStack_1590 = (fdb_kvs_handle *)0x11b8e6;
    fVar2 = fdb_kvs_open_default
                      (pfStack_1568,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)&_Stack_1508);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbcd;
    unaff_R13 = (fdb_kvs_handle *)0x155958;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    do {
      pcVar8 = (char *)0xcccccccd;
      pfVar13 = (fdb_kvs_handle *)0x1555bd;
      pfVar15 = (fdb_kvs_handle *)(auStack_155c + 4);
      iVar3 = (int)unaff_R12;
      pfStack_1590 = (fdb_kvs_handle *)0x11b91a;
      sprintf((char *)pfVar15,"%d",unaff_R12);
      pfVar12 = pfStack_1570;
      pfStack_1590 = (fdb_kvs_handle *)0x11b927;
      sVar5 = strlen((char *)pfVar15);
      pfStack_1590 = (fdb_kvs_handle *)0x11b93e;
      fVar2 = fdb_set_kv(pfVar12,pfVar15,sVar5,"value",5);
      pfVar14 = unaff_R13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_1590 = (fdb_kvs_handle *)0x11bb86;
        auto_compaction_snapshots_test();
LAB_0011bb86:
        pfStack_1590 = (fdb_kvs_handle *)0x11bb8b;
        auto_compaction_snapshots_test();
LAB_0011bb8b:
        pfVar22 = pfVar12;
        pfStack_1590 = (fdb_kvs_handle *)0x11bb90;
        auto_compaction_snapshots_test();
LAB_0011bb90:
        pfStack_1590 = (fdb_kvs_handle *)0x11bb95;
        auto_compaction_snapshots_test();
LAB_0011bb95:
        pfStack_1590 = (fdb_kvs_handle *)0x11bb9a;
        auto_compaction_snapshots_test();
        unaff_R13 = pfVar14;
        doc_01 = (fdb_kvs_handle *)pcVar8;
LAB_0011bb9a:
        pfVar14 = unaff_R13;
        unaff_R13 = pfVar13;
        pfStack_1590 = (fdb_kvs_handle *)0x11bb9f;
        auto_compaction_snapshots_test();
LAB_0011bb9f:
        pfStack_1590 = (fdb_kvs_handle *)0x11bbac;
        auto_compaction_snapshots_test();
LAB_0011bbac:
        pfStack_1590 = (fdb_kvs_handle *)0x11bbb9;
        pfVar15 = pfVar22;
        auto_compaction_snapshots_test();
LAB_0011bbb9:
        pfStack_1590 = (fdb_kvs_handle *)0x11bbbe;
        auto_compaction_snapshots_test();
        pfVar12 = unaff_R13;
        pcVar8 = (char *)doc_01;
LAB_0011bbbe:
        unaff_R13 = pfVar14;
        pfStack_1590 = (fdb_kvs_handle *)0x11bbc3;
        auto_compaction_snapshots_test();
LAB_0011bbc3:
        pfVar21 = (filemgr_ops *)(auStack_155c + 4);
        pfStack_1590 = (fdb_kvs_handle *)0x11bbc8;
        auto_compaction_snapshots_test();
        goto LAB_0011bbc8;
      }
      pfVar12 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 10) * 10 == iVar3) {
        pfVar15 = (fdb_kvs_handle *)0x0;
        pfStack_1590 = (fdb_kvs_handle *)0x11b96a;
        fVar2 = fdb_commit(pfStack_1568,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb86;
      }
      pfVar22 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 100) * 100 == iVar3) {
        pfStack_1590 = (fdb_kvs_handle *)0x11b99b;
        fVar2 = fdb_get_kvs_info(pfStack_1570,&fStack_14e8);
        pfVar22 = (fdb_kvs_handle *)fStack_14e8.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8b;
        pfStack_1590 = (fdb_kvs_handle *)0x11b9bd;
        fVar2 = fdb_snapshot_open(pfStack_1570,&pfStack_1578,fStack_14e8.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb95;
        pfStack_1590 = (fdb_kvs_handle *)0x11b9e3;
        fdb_doc_create((fdb_doc **)&pfStack_1580,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_1580->fhandle = (fdb_file_handle *)pfVar22;
        pfStack_1590 = (fdb_kvs_handle *)0x11b9f6;
        fVar2 = fdb_get_byseq(pfStack_1578,(fdb_doc *)pfStack_1580);
        pfVar14 = pfStack_1580;
        doc_01 = (fdb_kvs_handle *)pcVar8;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb9a;
        pcVar8 = (char *)pfStack_1580->op_stats;
        pfStack_1590 = (fdb_kvs_handle *)0x11ba17;
        sVar5 = strlen(auStack_155c + 4);
        pfStack_1590 = (fdb_kvs_handle *)0x11ba25;
        iVar4 = bcmp(pcVar8,auStack_155c + 4,sVar5);
        doc_01 = (fdb_kvs_handle *)pcVar8;
        if (iVar4 != 0) goto LAB_0011bb9f;
        pfStack_1590 = (fdb_kvs_handle *)0x11ba35;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_1590 = (fdb_kvs_handle *)0x11ba3f;
        fVar2 = fdb_kvs_close(pfStack_1578);
        pfVar13 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb90;
        pfVar15 = (fdb_kvs_handle *)&pfStack_1578;
        pfStack_1590 = (fdb_kvs_handle *)0x11ba5d;
        fVar2 = fdb_snapshot_open(pfStack_1570,(fdb_kvs_handle **)pfVar15,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbb9;
        pfStack_1590 = (fdb_kvs_handle *)0x11ba83;
        fdb_doc_create((fdb_doc **)&pfStack_1580,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_1580->fhandle = (fdb_file_handle *)pfVar22;
        pfStack_1590 = (fdb_kvs_handle *)0x11ba96;
        pfVar15 = pfStack_1580;
        fVar2 = fdb_get_byseq(pfStack_1578,(fdb_doc *)pfStack_1580);
        doc_01 = pfStack_1580;
        pfVar12 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbbe;
        pfVar22 = (fdb_kvs_handle *)pfStack_1580->op_stats;
        pfVar15 = (fdb_kvs_handle *)(auStack_155c + 4);
        pfStack_1590 = (fdb_kvs_handle *)0x11bab4;
        sVar5 = strlen((char *)pfVar15);
        pfStack_1590 = (fdb_kvs_handle *)0x11bac2;
        iVar4 = bcmp(pfVar22,pfVar15,sVar5);
        if (iVar4 != 0) goto LAB_0011bbac;
        pfStack_1590 = (fdb_kvs_handle *)0x11bad2;
        fdb_doc_free((fdb_doc *)doc_01);
        pfStack_1590 = (fdb_kvs_handle *)0x11badc;
        fVar2 = fdb_kvs_close(pfStack_1578);
        pcVar8 = (char *)0xcccccccd;
        pfVar12 = (fdb_kvs_handle *)0x1555bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011baf4;
        goto LAB_0011bbc3;
      }
LAB_0011baf4:
      pfVar21 = (filemgr_ops *)(auStack_155c + 4);
      pcVar8 = (char *)0xcccccccd;
      pfVar12 = (fdb_kvs_handle *)0x1555bd;
      unaff_R12 = (fdb_kvs_handle *)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 100000);
    pfStack_1590 = (fdb_kvs_handle *)0x11bb0e;
    fVar2 = fdb_close(pfStack_1568);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbd2;
    pfStack_1590 = (fdb_kvs_handle *)0x11bb1b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1590 = (fdb_kvs_handle *)0x11bb28;
      memleak_end();
      pfStack_1590 = (fdb_kvs_handle *)0x11bb42;
      sprintf(auStack_155c + 4,"auto compaction completed %d times with snapshots",
              (ulong)(uint)auStack_155c._0_4_);
      pcVar8 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_1590 = (fdb_kvs_handle *)0x11bb6f;
      fprintf(_stderr,pcVar8,auStack_155c + 4);
      return;
    }
  }
  else {
LAB_0011bbc8:
    pfStack_1590 = (fdb_kvs_handle *)0x11bbcd;
    auto_compaction_snapshots_test();
LAB_0011bbcd:
    pfStack_1590 = (fdb_kvs_handle *)0x11bbd2;
    auto_compaction_snapshots_test();
LAB_0011bbd2:
    pfStack_1590 = (fdb_kvs_handle *)0x11bbd7;
    auto_compaction_snapshots_test();
  }
  pfStack_1590 = (fdb_kvs_handle *)compaction_cb_count;
  auto_compaction_snapshots_test();
  pfVar14 = (fdb_kvs_handle *)((ulong)pfVar15 & 0xffffffff);
  __tv = &tStack_15a8;
  pfStack_15b8 = (fdb_kvs_handle *)0x11bbf3;
  pfStack_1598 = pfVar22;
  pfStack_1590 = pfVar12;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if ((int)pfVar15 == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&pfStack_1580->kvs_config = *(int *)&pfStack_1580->kvs_config + 1;
      return;
    }
  }
  else {
    pfStack_15b8 = (fdb_kvs_handle *)0x11bc12;
    compaction_cb_count();
  }
  pfStack_15b8 = (fdb_kvs_handle *)rollback_during_ops_test;
  compaction_cb_count();
  pfStack_1840 = (fdb_kvs_handle *)0x11bc37;
  pfStack_15d8 = unaff_R12;
  pfStack_15d0 = unaff_R13;
  pfStack_15c8 = pfVar21;
  pfStack_15c0 = (fdb_kvs_handle *)pcVar8;
  pfStack_15b8 = pfVar14;
  gettimeofday((timeval *)(auStack_180f + 0x2f),(__timezone_ptr_t)0x0);
  pfStack_1840 = (fdb_kvs_handle *)0x11bc3c;
  memleak_start();
  uStack_181c = 10000;
  if (__tv == (timeval *)0x0) {
    pfStack_1840 = (fdb_kvs_handle *)0x11bc59;
    system("rm -rf  mvcc_test* > errorlog.txt");
    pfStack_1840 = (fdb_kvs_handle *)0x11bc66;
    fdb_get_default_config();
    fconfig_01 = &fStack_16d8;
    pfStack_1840 = (fdb_kvs_handle *)0x11bc7e;
    memcpy(fconfig_01,auStack_17d0,0xf8);
    fStack_16d8.block_reusing_threshold = 0;
    pfStack_1840 = (fdb_kvs_handle *)0x11bc9d;
    fVar2 = fdb_open(&pfStack_1828,"mvcc_test1",fconfig_01);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1840 = (fdb_kvs_handle *)0x11bcb2;
      fdb_get_default_kvs_config();
      auStack_180f._39_8_ = uStack_17c0;
      auStack_180f._23_8_ = auStack_17d0._0_8_;
      auStack_180f._31_8_ = auStack_17d0._8_8_;
      pfStack_1840 = (fdb_kvs_handle *)0x11bcd4;
      fVar2 = fdb_kvs_open_default
                        (pfStack_1828,&pfStack_1830,(fdb_kvs_config *)(auStack_180f + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
      unaff_R13 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
      __tv = (timeval *)0x1;
      uVar11 = 0;
      do {
        uVar10 = uVar11 + 1;
        pfVar14 = (fdb_kvs_handle *)(ulong)uVar10;
        pfStack_1840 = (fdb_kvs_handle *)0x11bd03;
        sprintf(auStack_180f,"%d",pfVar14);
        unaff_R12 = pfStack_1830;
        pfStack_1840 = (fdb_kvs_handle *)0x11bd10;
        sVar5 = strlen(auStack_180f);
        pfStack_1840 = (fdb_kvs_handle *)0x11bd2b;
        fVar2 = fdb_set_kv(unaff_R12,auStack_180f,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pfStack_1840 = (fdb_kvs_handle *)0x11bfab;
          rollback_during_ops_test();
          goto LAB_0011bfab;
        }
        if ((int)((ulong)__tv / 10) * 10 - 1U == uVar11) {
          unaff_R13 = (fdb_kvs_handle *)((ulong)unaff_R13 ^ 1);
          pfStack_1840 = (fdb_kvs_handle *)0x11bd66;
          fdb_commit(pfStack_1828,(fdb_commit_opt_t)unaff_R13);
        }
        __tv = (timeval *)(ulong)((int)__tv + 1);
        uVar11 = uVar10;
      } while (uVar10 < 10000);
      pfVar14 = (fdb_kvs_handle *)0x1;
      pfStack_1840 = (fdb_kvs_handle *)0x11bd8b;
      fdb_commit(pfStack_1828,'\x01');
      pfStack_1840 = (fdb_kvs_handle *)0x11bd9a;
      fdb_get_kvs_info(pfStack_1830,(fdb_kvs_info *)auStack_17d0);
      __tv = (timeval *)(auStack_17d0 + 8);
      if ((fdb_config *)auStack_17d0._8_8_ != (fdb_config *)0x2710) {
        pfStack_1840 = (fdb_kvs_handle *)0x11bdb0;
        rollback_during_ops_test();
      }
      pfStack_1840 = (fdb_kvs_handle *)0x11bdc8;
      pthread_create(&pStack_1818,(pthread_attr_t *)0x0,rollback_during_ops_test,&uStack_181c);
      fconfig_01 = (fdb_config *)0x155958;
      pcVar8 = auStack_180f;
      unaff_R12 = (fdb_kvs_handle *)0x1555bd;
      do {
        pfStack_1840 = (fdb_kvs_handle *)0x11bdea;
        sprintf(pcVar8,"%d",pfVar14);
        unaff_R13 = pfStack_1830;
        pfStack_1840 = (fdb_kvs_handle *)0x11bdf7;
        sVar5 = strlen(pcVar8);
        pfStack_1840 = (fdb_kvs_handle *)0x11be0e;
        fVar2 = fdb_set_kv(unaff_R13,pcVar8,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
          pfStack_1840 = (fdb_kvs_handle *)0x11be2a;
          fVar2 = fdb_commit(pfStack_1828,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011bfb0;
        }
        uVar11 = (int)pfVar14 + 1;
        pfVar14 = (fdb_kvs_handle *)(ulong)uVar11;
      } while (uVar11 != 0x2711);
      pfStack_1840 = (fdb_kvs_handle *)0x11be50;
      pthread_join(pStack_1818,(void **)(auStack_180f + 0xf));
      pfStack_1840 = (fdb_kvs_handle *)0x11be73;
      fVar2 = fdb_set_kv(pfStack_1830,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
      pfStack_1840 = (fdb_kvs_handle *)0x11be8a;
      fVar2 = fdb_commit(pfStack_1828,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
      pfStack_1840 = (fdb_kvs_handle *)0x11bea4;
      fdb_get_kvs_info(pfStack_1830,(fdb_kvs_info *)auStack_17d0);
      fconfig_01 = (fdb_config *)auStack_17d0._8_8_;
      pfStack_1840 = (fdb_kvs_handle *)0x11becb;
      fVar2 = fdb_set_kv(pfStack_1830,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
      pfStack_1840 = (fdb_kvs_handle *)0x11bef6;
      fVar2 = fdb_set_kv(pfStack_1830,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
      pfStack_1840 = (fdb_kvs_handle *)0x11bf0d;
      fVar2 = fdb_commit(pfStack_1828,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
      pfStack_1840 = (fdb_kvs_handle *)0x11bf22;
      fVar2 = fdb_rollback(&pfStack_1830,(fdb_seqnum_t)fconfig_01);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_1840 = (fdb_kvs_handle *)0x11bf3c;
        fdb_get_kvs_info(pfStack_1830,(fdb_kvs_info *)auStack_17d0);
        if ((fdb_config *)auStack_17d0._8_8_ != fconfig_01) {
          pfStack_1840 = (fdb_kvs_handle *)0x11bf4d;
          rollback_during_ops_test();
        }
        pfStack_1840 = (fdb_kvs_handle *)0x11bf57;
        fdb_close(pfStack_1828);
        pfStack_1840 = (fdb_kvs_handle *)0x11bf5c;
        fdb_shutdown();
        pfStack_1840 = (fdb_kvs_handle *)0x11bf61;
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        pfStack_1840 = (fdb_kvs_handle *)0x11bf92;
        fprintf(_stderr,pcVar8,"rollback during ops test");
        return;
      }
    }
    else {
      pfStack_1840 = (fdb_kvs_handle *)0x11c0df;
      rollback_during_ops_test();
LAB_0011c0df:
      __tv = (timeval *)auStack_17d0;
      pfStack_1840 = (fdb_kvs_handle *)0x11c0e4;
      rollback_during_ops_test();
LAB_0011c0e4:
      pfStack_1840 = (fdb_kvs_handle *)0x11c0e9;
      rollback_during_ops_test();
LAB_0011c0e9:
      pfStack_1840 = (fdb_kvs_handle *)0x11c0ee;
      rollback_during_ops_test();
LAB_0011c0ee:
      pfStack_1840 = (fdb_kvs_handle *)0x11c0f3;
      rollback_during_ops_test();
LAB_0011c0f3:
      pfStack_1840 = (fdb_kvs_handle *)0x11c0f8;
      rollback_during_ops_test();
LAB_0011c0f8:
      pfStack_1840 = (fdb_kvs_handle *)0x11c0fd;
      rollback_during_ops_test();
    }
    pfStack_1840 = (fdb_kvs_handle *)0x11c102;
    rollback_during_ops_test();
LAB_0011c102:
    pfStack_1840 = (fdb_kvs_handle *)0x11c107;
    rollback_during_ops_test();
  }
  else {
LAB_0011bfb5:
    fconfig_01 = (fdb_config *)auStack_17d0;
    pfStack_1840 = (fdb_kvs_handle *)0x11bfc2;
    fdb_get_default_config();
    pcVar8 = (char *)&fStack_16d8;
    pfStack_1840 = (fdb_kvs_handle *)0x11bfda;
    memcpy(pcVar8,fconfig_01,0xf8);
    fStack_16d8.block_reusing_threshold = 0;
    pfStack_1840 = (fdb_kvs_handle *)0x11bff9;
    fVar2 = fdb_open(&pfStack_1828,"mvcc_test1",(fdb_config *)pcVar8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
    fconfig_01 = (fdb_config *)auStack_17d0;
    pfStack_1840 = (fdb_kvs_handle *)0x11c00e;
    fdb_get_default_kvs_config();
    auStack_180f._39_8_ = uStack_17c0;
    auStack_180f._23_8_ = auStack_17d0._0_8_;
    auStack_180f._31_8_ = auStack_17d0._8_8_;
    pfStack_1840 = (fdb_kvs_handle *)0x11c031;
    fVar2 = fdb_kvs_open_default(pfStack_1828,&pfStack_1830,(fdb_kvs_config *)(auStack_180f + 0x17))
    ;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      __tv = (timeval *)(long)(int)__tv->tv_sec;
      if (1 < (long)__tv) {
        unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
        fconfig_01 = (fdb_config *)0x155958;
        pcVar8 = auStack_180f;
        unaff_R12 = (fdb_kvs_handle *)0x1555bd;
        do {
          pfStack_1840 = (fdb_kvs_handle *)0x11c06e;
          sprintf(pcVar8,"%d",(ulong)__tv & 0xffffffff);
          pfVar14 = pfStack_1830;
          pfStack_1840 = (fdb_kvs_handle *)0x11c07b;
          sVar5 = strlen(pcVar8);
          pfStack_1840 = (fdb_kvs_handle *)0x11c092;
          fVar2 = fdb_set_kv(pfVar14,pcVar8,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            pfStack_1840 = (fdb_kvs_handle *)0x11c0b8;
            fVar2 = fdb_rollback(&pfStack_1830,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      pfStack_1840 = (fdb_kvs_handle *)0x11c0d3;
      fdb_close(pfStack_1828);
      pfStack_1840 = (fdb_kvs_handle *)0x11c0da;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_1840 = (fdb_kvs_handle *)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  pfStack_1840 = (fdb_kvs_handle *)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  pfStack_1840 = (fdb_kvs_handle *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_19f8 = (fdb_kvs_handle *)0x11c132;
  ptStack_1860 = __tv;
  pfStack_1858 = unaff_R12;
  pfStack_1850 = unaff_R13;
  pfStack_1848 = fconfig_01;
  pfStack_1840 = (fdb_kvs_handle *)pcVar8;
  gettimeofday((timeval *)(auStack_19bf + 0xf),(__timezone_ptr_t)0x0);
  pfStack_19f8 = (fdb_kvs_handle *)0x11c137;
  memleak_start();
  pfStack_19f8 = (fdb_kvs_handle *)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &fStack_1958;
  pfStack_19f8 = (fdb_kvs_handle *)0x11c153;
  fdb_get_default_config();
  pfStack_19f8 = (fdb_kvs_handle *)0x11c167;
  fVar2 = fdb_open(&pfStack_19e0,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00 = (fdb_config *)(auStack_19a0 + 0x30);
    pfStack_19f8 = (fdb_kvs_handle *)0x11c17f;
    fdb_get_default_kvs_config();
    pfStack_19f8 = (fdb_kvs_handle *)0x11c191;
    fVar2 = fdb_kvs_open_default(pfStack_19e0,&pfStack_19e8,(fdb_kvs_config *)fconfig_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig_00 = (fdb_config *)0x1;
    fconfig_01 = (fdb_config *)0x155958;
    pcVar8 = auStack_19bf;
    unaff_R12 = (fdb_kvs_handle *)0x1555bd;
    do {
      pfStack_19f8 = (fdb_kvs_handle *)0x11c1c0;
      sprintf(pcVar8,"%d",fconfig_00);
      unaff_R13 = pfStack_19e8;
      pfStack_19f8 = (fdb_kvs_handle *)0x11c1cd;
      sVar5 = strlen(pcVar8);
      pfStack_19f8 = (fdb_kvs_handle *)0x11c1e4;
      fVar2 = fdb_set_kv(unaff_R13,pcVar8,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_19f8 = (fdb_kvs_handle *)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar11 = (int)fconfig_00 + 1;
      fconfig_00 = (fdb_config *)(ulong)uVar11;
    } while (uVar11 != 4);
    pfStack_19f8 = (fdb_kvs_handle *)0x11c1ff;
    fdb_commit(pfStack_19e0,'\0');
    pfStack_19f8 = (fdb_kvs_handle *)0x11c222;
    fVar2 = fdb_set_kv(pfStack_19e8,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c24d;
    fVar2 = fdb_set_kv(pfStack_19e8,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c264;
    fVar2 = fdb_commit(pfStack_19e0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c27b;
    fVar2 = fdb_rollback(&pfStack_19e8,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig_00 = (fdb_config *)auStack_19a0;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c295;
    fdb_get_kvs_info(pfStack_19e8,(fdb_kvs_info *)fconfig_00);
    if (auStack_19a0._8_8_ != 3) {
      pfStack_19f8 = (fdb_kvs_handle *)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    pfStack_19f8 = (fdb_kvs_handle *)0x11c2bc;
    fVar2 = fdb_snapshot_open(pfStack_19e8,&pfStack_19c8,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    pfStack_19f8 = (fdb_kvs_handle *)0x11c2e4;
    fdb_iterator_init(pfStack_19c8,&pfStack_19d8,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_00 = (fdb_config *)&pfStack_19d0;
    pfStack_19d0 = (fdb_doc *)0x0;
    fconfig_01 = (fdb_config *)0x3;
    do {
      pfStack_19f8 = (fdb_kvs_handle *)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_19d8,(fdb_doc **)fconfig_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      pfStack_19f8 = (fdb_kvs_handle *)0x11c315;
      fdb_doc_free(pfStack_19d0);
      pfStack_19d0 = (fdb_doc *)0x0;
      pfStack_19f8 = (fdb_kvs_handle *)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_19d8);
      fconfig_01 = (fdb_config *)&fconfig_01[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_01 == (fdb_config *)0x0) {
      pfStack_19f8 = (fdb_kvs_handle *)0x11c343;
      fdb_iterator_close(pfStack_19d8);
      pfStack_19f8 = (fdb_kvs_handle *)0x11c34d;
      fdb_kvs_close(pfStack_19c8);
      pfStack_19f8 = (fdb_kvs_handle *)0x11c357;
      fdb_close(pfStack_19e0);
      pfStack_19f8 = (fdb_kvs_handle *)0x11c35c;
      fdb_shutdown();
      pfStack_19f8 = (fdb_kvs_handle *)0x11c361;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pfStack_19f8 = (fdb_kvs_handle *)0x11c392;
      fprintf(_stderr,pcVar8,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c3ad:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    pfStack_19f8 = (fdb_kvs_handle *)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  pfStack_19f8 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_3eb0 = (code *)0x11c3f2;
  pfStack_1a20 = fconfig_00;
  pfStack_1a18 = unaff_R12;
  pfStack_1a10 = unaff_R13;
  pfStack_1a08 = fconfig_01;
  pfStack_1a00 = (fdb_kvs_handle *)pcVar8;
  pfStack_19f8 = pfVar14;
  gettimeofday(&tStack_3e38,(__timezone_ptr_t)0x0);
  pcStack_3eb0 = (code *)0x11c3f7;
  memleak_start();
  pcStack_3eb0 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_3eb0 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_3eb0 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_3d20.wal_threshold = 0x400;
  fStack_3d20.compaction_mode = 0;
  fStack_3d20.durability_opt = 2;
  pfVar12 = (fdb_kvs_handle *)(apfStack_3b28 + 0x20);
  ppfVar9 = apfStack_3e28;
  pcVar8 = "kvs%d";
  uVar19 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_3eb0 = (code *)0x11c45d;
    sprintf((char *)ppfVar9,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar20 = (char *)(apfStack_3e98 + (long)__s);
    pcStack_3eb0 = (code *)0x11c478;
    ppfVar17 = (fdb_kvs_handle **)pcVar20;
    fVar2 = fdb_open((fdb_file_handle **)pcVar20,(char *)ppfVar9,
                     (fdb_config *)(apfStack_3e28 + 0x21));
    iVar3 = (int)ppfVar17;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar17 = (fdb_kvs_handle **)0x0;
    ppfStack_3ea8 = __s;
    pfStack_3ea0 = pfVar12;
    do {
      __s = ppfVar17;
      pcStack_3eb0 = (code *)0x11c49d;
      sprintf((char *)ppfVar9,"kvs%d",(ulong)(uint)((int)__s + (int)uVar19));
      pfVar22 = *(fdb_kvs_handle **)pcVar20;
      pcStack_3eb0 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar22,(fdb_kvs_handle **)pfVar12,(char *)ppfVar9,
                           (fdb_kvs_config *)(apfStack_3e98 + 9));
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_3eb0 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).custom_cmp;
      ppfVar17 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_3ea8 + 1);
    uVar19 = uVar19 + 0x80;
    pfVar12 = (fdb_kvs_handle *)&pfStack_3ea0[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_3e28 + 0x40;
  ppfVar9 = apfStack_3b28;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    uVar19 = 0;
    do {
      pcStack_3eb0 = (code *)0x11c511;
      sprintf((char *)__s,"key%08d",uVar19);
      pcStack_3eb0 = (code *)0x11c524;
      sprintf((char *)ppfVar9,"value%08d",uVar19);
      pcVar8 = (char *)apfStack_3b28[(long)&pfVar12->op_stats];
      pcStack_3eb0 = (code *)0x11c534;
      sVar5 = strlen((char *)__s);
      pcVar20 = (char *)(sVar5 + 1);
      pcStack_3eb0 = (code *)0x11c540;
      sVar5 = strlen((char *)ppfVar9);
      pcStack_3eb0 = (code *)0x11c555;
      pfVar22 = (fdb_kvs_handle *)pcVar8;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar8,__s,(size_t)pcVar20,ppfVar9,sVar5 + 1);
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar11 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar11;
    } while (uVar11 != 10);
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
  } while (pfVar12 != (fdb_kvs_handle *)0x400);
  pcVar20 = (char *)0x0;
  do {
    pfVar22 = apfStack_3e98[(long)pcVar20];
    if (((ulong)pcVar20 & 1) == 0) {
      pcStack_3eb0 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar22,'\0');
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_3eb0 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar22,'\x01');
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while (pcVar20 != (char *)0x8);
  pcVar20 = "key%08d";
  __s = apfStack_3e28 + 0x40;
  ppfVar9 = (fdb_kvs_handle **)0x0;
  do {
    uVar19 = 0;
    do {
      pcStack_3eb0 = (code *)0x11c5ca;
      sprintf((char *)__s,"key%08d",uVar19);
      pfVar12 = apfStack_3b28[(long)(ppfVar9 + 4)];
      pcStack_3eb0 = (code *)0x11c5da;
      sVar5 = strlen((char *)__s);
      pcStack_3eb0 = (code *)0x11c5e9;
      pfVar22 = pfVar12;
      fVar2 = fdb_del_kv(pfVar12,__s,sVar5 + 1);
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar11 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar11;
    } while (uVar11 != 10);
    ppfVar9 = (fdb_kvs_handle **)((long)ppfVar9 + 1);
  } while (ppfVar9 != (fdb_kvs_handle **)0x400);
  pcVar20 = (char *)0x0;
  do {
    pfVar22 = apfStack_3e98[(long)pcVar20];
    if (((ulong)pcVar20 & 1) == 0) {
      pcStack_3eb0 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar22,'\0');
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_3eb0 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar22,'\x01');
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while (pcVar20 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar20 = (char *)(apfStack_3b28 + 0x20);
  do {
    pcStack_3eb0 = (code *)0x11c657;
    ppfVar17 = (fdb_kvs_handle **)pcVar20;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar20,10);
    iVar3 = (int)ppfVar17;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    __s = __s + 8;
    pcVar20 = (char *)((long)pcVar20 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar9 = apfStack_3e98;
  pcVar20 = "kvs%d";
  __s = apfStack_3e28;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    pfVar22 = apfStack_3b28[(long)&pfVar12->op_stats];
    pcStack_3eb0 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar22);
    iVar3 = (int)pfVar22;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_3eb0 = (code *)0x11c6af;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar12 & 0xffffffff);
    pfVar22 = *ppfVar9;
    pcStack_3eb0 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar22,(char *)__s);
    iVar3 = (int)pfVar22;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->config).wal_threshold;
    ppfVar9 = ppfVar9 + 1;
  } while (pfVar12 != (fdb_kvs_handle *)0x400);
  pcVar20 = (char *)0x0;
  do {
    pfVar22 = apfStack_3e98[(long)pcVar20];
    if (((ulong)pcVar20 & 1) == 0) {
      pcStack_3eb0 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar22,'\0');
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_3eb0 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar22,'\x01');
      iVar3 = (int)pfVar22;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar20 = (char *)((long)pcVar20 + 1);
  } while (pcVar20 != (char *)0x8);
  pcVar20 = "mvcc_test_compact%d";
  __s = apfStack_3e28;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_3eb0 = (code *)0x11c72d;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar12 & 0xffffffff);
    pfVar22 = apfStack_3e98[(long)pfVar12];
    pcStack_3eb0 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar22,(char *)__s);
    iVar3 = (int)pfVar22;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
  } while (pfVar12 != (fdb_kvs_handle *)0x8);
  pcVar20 = (char *)0x0;
  pcStack_3eb0 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar22 = apfStack_3e98[(long)pcVar20];
    pcStack_3eb0 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar22);
    iVar3 = (int)pfVar22;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar20 = (char *)((long)pcVar20 + 1);
    if (pcVar20 == (char *)0x8) {
      pcStack_3eb0 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_3eb0 = (code *)0x11c775;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_3eb0 = (code *)0x11c7a6;
      fprintf(_stderr,pcVar8,"open multi files kvs test");
      return;
    }
  }
LAB_0011c7e0:
  pcStack_3eb0 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_3eb0 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_3eb0 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_3eb0 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_3eb0 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_3eb0 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_3eb0 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_43b8 = (code *)0x11c825;
  ppfStack_3ed8 = (fdb_kvs_handle **)pcVar20;
  ppfStack_3ed0 = ppfVar9;
  pfStack_3ec8 = (fdb_kvs_handle *)pcVar8;
  ppfStack_3ec0 = __s;
  pfStack_3eb8 = pfVar12;
  pcStack_3eb0 = (code *)uVar19;
  gettimeofday(&tStack_4330,(__timezone_ptr_t)0x0);
  pcStack_43b8 = (code *)0x11c82a;
  memleak_start();
  pcStack_43b8 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_43b8 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_3fd0.flags = 1;
  fStack_3fd0.block_reusing_threshold = 0;
  fStack_3fd0.seqtree_opt = 0;
  pcStack_43b8 = (code *)0x11c86a;
  fStack_3fd0.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_43b8 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_43a0,"./mvcc_test1",(fdb_config *)(acStack_40d0 + 0x100));
  iStack_437c = iVar3;
  if (iVar3 == 0) {
    pcStack_43b8 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_43a0,apfStack_4370,&fStack_4350);
    pcVar8 = (char *)0x1;
  }
  else {
    ppfVar9 = apfStack_4370;
    uVar19 = 0;
    do {
      pcStack_43b8 = (code *)0x11c8af;
      sprintf(acStack_4338,"kv%d",uVar19 & 0xffffffff);
      pcStack_43b8 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_43a0,ppfVar9,acStack_4338,&fStack_4350);
      uVar19 = uVar19 + 1;
      ppfVar9 = ppfVar9 + 1;
    } while (uVar19 != 3);
    pcVar8 = (char *)0x3;
  }
  uStack_43a4 = 0;
  do {
    uVar19 = 0;
    do {
      pcStack_43b8 = (code *)0x11c916;
      sprintf(acStack_41d0,"key%d",uVar19 & 0xffffffff);
      pcStack_43b8 = (code *)0x11c937;
      sprintf(acStack_4320,"meta-%d-%d",(ulong)uStack_43a4,uVar19 & 0xffffffff);
      pcStack_43b8 = (code *)0x11c956;
      sprintf(acStack_40d0,"body-%d-%d",(ulong)uStack_43a4,uVar19 & 0xffffffff);
      doc = (btree *)(&bStack_4220.ksize + uVar19 * 8);
      pcStack_43b8 = (code *)0x11c969;
      sVar5 = strlen(acStack_41d0);
      pcStack_43b8 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_4320);
      pcStack_43b8 = (code *)0x11c984;
      sVar6 = strlen(acStack_40d0);
      pcStack_43b8 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc,acStack_41d0,sVar5,acStack_4320,metalen._M_i,acStack_40d0,sVar6
                    );
      pfVar12 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_43b8 = (code *)0x11c9ba;
        fdb_set(apfStack_4370[(long)pfVar12],*(fdb_doc **)doc);
        pfVar12 = (fdb_kvs_handle *)((long)pfVar12 + 1);
      } while ((fdb_kvs_handle *)pcVar8 != pfVar12);
      pcStack_43b8 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_4220.ksize + uVar19 * 8));
      uVar19 = uVar19 + 1;
    } while (uVar19 != 10);
    pcStack_43b8 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_43a0,~(byte)uStack_43a4 & 1);
    uStack_43a4 = uStack_43a4 + 1;
    pcVar20 = (char *)(ulong)uStack_43a4;
  } while (uStack_43a4 != 5);
  pcStack_43b8 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_43a0,&pfStack_4388,&uStack_4358);
  pfVar22 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_43b8 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_4370,(pfStack_4388[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_4398 = (fdb_kvs_handle *)0x0;
    pcVar20 = acStack_40d0;
    pfVar22 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_43b8 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_4370[(long)pfVar22],&pfStack_4378,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_43b8 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_43b8 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_43b8 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_43b8 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_43b8 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_4378,&pfStack_4390,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_43b8 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_43b8 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_4390,(fdb_doc **)&pfStack_4398);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_43b8 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_43b8 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_43b8 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_43b8 = (code *)0x11cacd;
        sprintf(acStack_41d0,"key%d",metalen._M_i);
        if (pfVar22 == (fdb_kvs_handle *)0x0) {
          pcStack_43b8 = (code *)0x11cb1c;
          sprintf(acStack_4320,"meta-1-%d",metalen._M_i);
          pcStack_43b8 = (code *)0x11cb30;
          sprintf(pcVar20,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_43b8 = (code *)0x11caf0;
          sprintf(acStack_4320,"meta-%d-%d",4,metalen._M_i);
          pcStack_43b8 = (code *)0x11cb09;
          sprintf(pcVar20,"body-%d-%d",4);
        }
        pfVar12 = pfStack_4398;
        doc = (btree *)pfStack_4398->op_stats;
        pcStack_43b8 = (code *)0x11cb4c;
        iVar3 = bcmp(doc,acStack_41d0,*(size_t *)&pfStack_4398->kvs_config);
        if (iVar3 != 0) {
          pcStack_43b8 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc = pfVar12->staletree;
        pcStack_43b8 = (code *)0x11cb6c;
        iVar3 = bcmp(doc,acStack_4320,(size_t)(pfVar12->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cce6;
        doc = (pfVar12->field_6).seqtree;
        pcStack_43b8 = (code *)0x11cb87;
        iVar3 = bcmp(doc,pcVar20,(size_t)(pfVar12->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011ccd6;
        pcStack_43b8 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar12);
        pfStack_4398 = (fdb_kvs_handle *)0x0;
        uVar11 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar11;
        pcStack_43b8 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_4390);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar11 != 10) goto LAB_0011cd00;
      pcStack_43b8 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_4390);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_43b8 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_4378);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar22 = (fdb_kvs_handle *)&(pfVar22->kvs_config).field_0x1;
    } while (pfVar22 != (fdb_kvs_handle *)pcVar8);
    pcVar20 = (char *)0x0;
    do {
      pcStack_43b8 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_4370[(long)pcVar20]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar20 = pcVar20 + 1;
    } while (pcVar8 != pcVar20);
    pcStack_43b8 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_43a0,pfStack_4388[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_43b8 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_4388,uStack_4358);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_43b8 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_43a0);
      pcStack_43b8 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_43b8 = (code *)0x11cc52;
      memleak_end();
      pcVar8 = "single kv mode:";
      if ((char)iStack_437c != '\0') {
        pcVar8 = "multiple kv mode:";
      }
      pcStack_43b8 = (code *)0x11cc82;
      sprintf(acStack_40d0,"rollback without seqtree in %s",pcVar8);
      pcVar8 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_43b8 = (code *)0x11ccaf;
      fprintf(_stderr,pcVar8,acStack_40d0);
      return;
    }
  }
  else {
LAB_0011cd14:
    pcStack_43b8 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_43b8 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_43b8 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_43b8 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_4590 = (fdb_kvs_handle *)0x11cd45;
  pcStack_43e0 = pcVar20;
  aStack_43d8.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_43d0 = doc;
  pfStack_43c8 = pfVar12;
  pfStack_43c0 = pfVar22;
  pcStack_43b8 = (code *)pcVar8;
  gettimeofday(&tStack_4530,(__timezone_ptr_t)0x0);
  pfStack_4590 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_4590 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar8 = auStack_4520 + 0x48;
  pfStack_4590 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_4590 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_4588,"./mvcc_test2",(fdb_config *)pcVar8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar8 = auStack_4520;
    pfStack_4590 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_4538 = (btreeblk_handle *)auStack_4520._16_8_;
    pfStack_4548 = (filemgr *)auStack_4520._0_8_;
    pdStack_4540 = (docio_handle *)auStack_4520._8_8_;
    pfStack_4590 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_4588,&pfStack_4580,(fdb_kvs_config *)&pfStack_4548);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_4590 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_4588,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar8 = "key%d";
    pfVar12 = (fdb_kvs_handle *)acStack_4577;
    pfVar22 = (fdb_kvs_handle *)0x1555bd;
    uVar19 = 0;
    do {
      pfStack_4590 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar12,"key%d",uVar19);
      pfVar15 = pfStack_4580;
      pfStack_4590 = (fdb_kvs_handle *)0x11cdfd;
      sVar5 = strlen((char *)pfVar12);
      pfStack_4590 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(pfVar15,pfVar12,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_4590 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar11 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar11;
    } while (uVar11 != 10);
    pfStack_4590 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_4588,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_4590 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_4588,"./mvcc_test3");
    pfStack_4590 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_4588,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar8 = "key%d";
    pfVar12 = (fdb_kvs_handle *)acStack_4577;
    uVar11 = 0;
    do {
      pfStack_4590 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar12,"key%d",(ulong)uVar11);
      pfVar22 = pfStack_4580;
      pfStack_4590 = (fdb_kvs_handle *)0x11ce89;
      sVar5 = strlen((char *)pfVar12);
      pfStack_4590 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar22,pfVar12,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 10);
    pfStack_4590 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_4588,(fdb_file_info *)auStack_4520);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar8 = (char *)((ulong)auStack_4520._40_8_ / (ulong)uStack_44d4);
    pfStack_4590 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_4588);
    pfStack_4590 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_4590 = (fdb_kvs_handle *)0x11cf00;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_44d4 * (long)pcVar8,
                       (ulong)((uStack_44d4 >> 2) + uStack_44d4 * 2));
    if (iVar3 < 0) goto LAB_0011d0d2;
    pfStack_4590 = (fdb_kvs_handle *)0x11cf2a;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar8 * 4 + 8) * (ulong)uStack_44d4,
                       (ulong)(uStack_44d4 >> 2));
    if (iVar3 < 0) goto LAB_0011d0d7;
    pfStack_4590 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_4588,"./mvcc_test3",(fdb_config *)(auStack_4520 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar8 = (char *)&pfStack_4568;
    pfStack_4590 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_4538 = pbStack_4558;
    pfStack_4548 = pfStack_4568;
    pdStack_4540 = pdStack_4560;
    pfStack_4590 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_4588,&pfStack_4580,(fdb_kvs_config *)&pfStack_4548);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_4590 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_4588,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar11 = 0;
      do {
        pfStack_4590 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_4577,"key%d",(ulong)uVar11);
        pfVar22 = pfStack_4580;
        pfStack_4590 = (fdb_kvs_handle *)0x11cfc7;
        sVar5 = strlen(acStack_4577);
        pfStack_4590 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar22,acStack_4577,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 10);
      pfStack_4590 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_4588);
      pfVar22 = (fdb_kvs_handle *)&pfStack_4568;
      uVar11 = 0;
      while( true ) {
        pfStack_4590 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_4577,"key%d",(ulong)uVar11);
        pfVar12 = pfStack_4580;
        pfStack_4590 = (fdb_kvs_handle *)0x11d021;
        sVar5 = strlen(acStack_4577);
        pfStack_4590 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar12,acStack_4577,sVar5,(void **)pfVar22,&sStack_4550);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_4590 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_4568);
        uVar11 = uVar11 + 1;
        if (uVar11 == 10) {
          pfStack_4590 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_4588);
          pfStack_4590 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_4590 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar8 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar8 = "%s FAILED\n";
          }
          pfStack_4590 = (fdb_kvs_handle *)0x11d08e;
          fprintf(_stderr,pcVar8,"crash recover test");
          return;
        }
      }
LAB_0011d0af:
      pfVar12 = (fdb_kvs_handle *)acStack_4577;
      pcVar8 = "key%d";
      pfStack_4590 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_4590 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_4590 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_45a0 = (fdb_config *)pcVar8;
  pfStack_4598 = pfVar12;
  pfStack_4590 = pfVar22;
  gettimeofday(&tStack_46c0,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_46d0 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_46e0,"./mvcc_test1",&fStack_4698);
  fdb_kvs_open_default(pfStack_46e0,&pfStack_46c8,&fStack_46b0);
  fdb_kvs_open(pfStack_46e0,&pfStack_46e8,"kv",&fStack_46b0);
  fVar2 = fdb_set_kv(pfStack_46e8,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_46e8,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_46e0,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_46e8,&pfStack_46f0,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_46f0,&pfStack_46d8,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_46f0);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_46e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_46e0,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_46d8,&pfStack_46d0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_46d0);
    fVar2 = fdb_iterator_close(pfStack_46d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_46f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_46c8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_46e0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar8,"drop kv other handle test");
        return;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_to_wal_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 300;
    int num_kvs = 1;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_kvs_handle *snap_db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 256;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test8", &fconfig);

    fdb_kvs_open_default(dbfile, &db[0], &kvs_config);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_to_wal_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
    for (i=0; i<n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    } // after 256 items wal gets flushed before commit

    // commit normal but as wal was flushed, this will cause a wal flush again!
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // update first half documents again
    for (i = 0; i < n/2; i++){
        fdb_doc_free(doc[i]);
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "META%d", i);
        sprintf(bodybuf, "BODY%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    }

    // commit again, this time wal threshold not hit so no wal flush on commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // update remaining half documents
    for (; i < n; i++){
        fdb_doc_free(doc[i]);
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "Meta%d", i);
        sprintf(bodybuf, "Body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db[0], doc[i]);
    } // somewhere in this loop wal gets flushed before commit
    // normal commit results in wal flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_rollback(&db[0], n + n/2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 1; // pick a document in the WAL section upon rollback
    fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
    status = fdb_snapshot_open(db[0], &snap_db, n + n/2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_get(snap_db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    TEST_CHK(rdoc->seqnum == (fdb_seqnum_t)n + i + 1);
    fdb_doc_free(rdoc);
    fdb_kvs_close(snap_db);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback to wal test %s", multi_kv ? "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}